

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitTupleExtract(BinaryInstWriter *this,TupleExtract *curr)

{
  bool bVar1;
  uint *puVar2;
  BufferWithRandomAccess *pBVar3;
  U32LEB local_4c;
  ulong local_48;
  size_t i_1;
  iterator iStack_38;
  uint scratch;
  _Self local_30;
  ulong local_28;
  size_t i;
  size_t numVals;
  TupleExtract *curr_local;
  BinaryInstWriter *this_local;
  
  numVals = (size_t)curr;
  curr_local = (TupleExtract *)this;
  i = wasm::Type::size(&curr->tuple->type);
  for (local_28 = (ulong)(*(int *)(numVals + 0x18) + 1); local_28 < i; local_28 = local_28 + 1) {
    BufferWithRandomAccess::operator<<(this->o,'\x1a');
  }
  if (*(int *)(numVals + 0x18) != 0) {
    local_30._M_node =
         (_List_node_base *)
         InsertOrderedMap<wasm::Type,_unsigned_int>::find
                   (&this->scratchLocals,(Type *)(numVals + 8));
    iStack_38 = InsertOrderedMap<wasm::Type,_unsigned_int>::end(&this->scratchLocals);
    bVar1 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) {
      __assert_fail("scratchLocals.find(curr->type) != scratchLocals.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-stack.cpp"
                    ,0x7bf,"void wasm::BinaryInstWriter::visitTupleExtract(TupleExtract *)");
    }
    puVar2 = InsertOrderedMap<wasm::Type,_unsigned_int>::operator[]
                       (&this->scratchLocals,(Type *)(numVals + 8));
    i_1._4_4_ = *puVar2;
    pBVar3 = BufferWithRandomAccess::operator<<(this->o,'!');
    LEB<unsigned_int,_unsigned_char>::LEB((LEB<unsigned_int,_unsigned_char> *)&i_1,i_1._4_4_);
    BufferWithRandomAccess::operator<<(pBVar3,i_1._0_4_);
    for (local_48 = 0; local_48 < *(uint *)(numVals + 0x18); local_48 = local_48 + 1) {
      BufferWithRandomAccess::operator<<(this->o,'\x1a');
    }
    pBVar3 = BufferWithRandomAccess::operator<<(this->o,' ');
    LEB<unsigned_int,_unsigned_char>::LEB(&local_4c,i_1._4_4_);
    BufferWithRandomAccess::operator<<(pBVar3,local_4c);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitTupleExtract(TupleExtract* curr) {
  size_t numVals = curr->tuple->type.size();
  // Drop all values after the one we want
  for (size_t i = curr->index + 1; i < numVals; ++i) {
    o << int8_t(BinaryConsts::Drop);
  }
  // If the extracted value is the only one left, we're done
  if (curr->index == 0) {
    return;
  }
  // Otherwise, save it to a scratch local, drop the others, then retrieve it
  assert(scratchLocals.find(curr->type) != scratchLocals.end());
  auto scratch = scratchLocals[curr->type];
  o << int8_t(BinaryConsts::LocalSet) << U32LEB(scratch);
  for (size_t i = 0; i < curr->index; ++i) {
    o << int8_t(BinaryConsts::Drop);
  }
  o << int8_t(BinaryConsts::LocalGet) << U32LEB(scratch);
}